

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_scalar_umul128(uint16_t *in,uint32_t n,uint32_t *out)

{
  ulong *puVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar16 [32];
  
  uVar7 = (ulong)n;
  if (3 < n) {
    auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])out);
    auVar15._8_4_ = 0xfff;
    auVar15._0_8_ = 0xfff00000fff;
    auVar15._12_4_ = 0xfff;
    auVar16._16_4_ = 0xfff;
    auVar16._0_16_ = auVar15;
    auVar16._20_4_ = 0xfff;
    auVar16._24_4_ = 0xfff;
    auVar16._28_4_ = 0xfff;
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x19262626));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x30201000a0908));
    auVar17._8_8_ = 0x1249124912491249;
    auVar17._0_8_ = 0x1249124912491249;
    auVar18._8_8_ = 0x3801c00e007007;
    auVar18._0_8_ = 0x3801c00e007007;
    do {
      uVar5 = (uint)uVar7;
      uVar4 = 0xfff;
      if (uVar5 < 0xfff) {
        uVar4 = uVar5;
      }
      if ((uVar4 & 0xffc) == 0) {
        auVar20 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        lVar6 = 0;
      }
      else {
        if (0xffe < uVar7) {
          uVar7 = 0xfff;
        }
        uVar7 = (ulong)(uint)((int)(uVar7 >> 2) << 3);
        auVar21 = ZEXT1664((undefined1  [16])0x0);
        lVar6 = 0;
        do {
          uVar3 = *(ulong *)in;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar3 >> 2 & 0x1249124912491249;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar3;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar3 >> 1;
          auVar22 = vpunpcklqdq_avx(auVar22,auVar24);
          auVar22 = vpand_avx(auVar22,auVar17);
          uVar3 = vpextrq_avx(auVar22,1);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = auVar22._0_8_;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar3;
          lVar6 = lVar6 + (SUB168(auVar19 * ZEXT816(0x1000100010001),8) +
                           SUB168(auVar19 * ZEXT816(0x1000100010001),0) & 0x3801c00e007007U);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),8);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),8);
          auVar22 = vpunpcklqdq_avx(auVar25,auVar8);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),0);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),0);
          auVar19 = vpunpcklqdq_avx(auVar27,auVar26);
          auVar22 = vpaddq_avx(auVar19,auVar22);
          auVar22 = vpand_avx(auVar22,auVar18);
          auVar22 = vpaddq_avx(auVar22,auVar21._0_16_);
          auVar21 = ZEXT1664(auVar22);
          auVar20 = ZEXT1632(auVar22);
          in = (uint16_t *)((long)in + 8);
          uVar7 = uVar7 - 8;
        } while (uVar7 != 0);
      }
      uVar5 = uVar5 - (uVar4 & 0xffc);
      uVar7 = (ulong)uVar5;
      auVar19 = auVar20._0_16_;
      auVar23 = vpshufd_avx(auVar19,0xe8);
      auVar22 = vpand_avx(auVar23,auVar15);
      auVar28 = vpsrlq_avx(auVar19,0x33);
      auVar28 = vpshufd_avx(auVar28,0xe8);
      auVar20 = vpermq_avx2(auVar20,0x24);
      auVar9 = vpbroadcastq_avx512vl();
      auVar20 = vpblendd_avx2(auVar20,auVar9,0x30);
      auVar20 = vpsrlvq_avx2(auVar20,auVar2);
      auVar8 = vpmovqd_avx512vl(auVar20);
      auVar19 = vpshufd_avx(auVar19,0xee);
      auVar19 = vpinsrq_avx(auVar19,lVar6,1);
      auVar19 = vpsrlq_avx(auVar19,0x19);
      auVar19 = vpshufd_avx(auVar19,0xe8);
      auVar23 = vpsrld_avx(auVar23,0xc);
      auVar20._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar8;
      auVar20._16_16_ = ZEXT116(1) * auVar19;
      auVar9._0_8_ = auVar23._0_8_;
      auVar9._8_8_ = auVar9._0_8_;
      auVar9._16_8_ = auVar9._0_8_;
      auVar9._24_8_ = auVar9._0_8_;
      auVar20 = vpblendd_avx2(auVar20,auVar9,0xc0);
      auVar20 = vpand_avx2(auVar20,auVar16);
      auVar22 = vpinsrd_avx(auVar22,(uint)lVar6 & 0xfff,2);
      auVar9 = valignd_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar28),5);
      auVar9 = vpblendd_avx2(ZEXT1632(auVar22),auVar9,0xf8);
      auVar10 = vpbroadcastd_avx512vl();
      auVar21 = vinserti32x8_avx512dq(auVar11,auVar10,0);
      auVar21 = vpermt2q_avx512f(ZEXT3264(auVar20),auVar12,
                                 ZEXT3264(CONCAT428(auVar9._28_4_,
                                                    CONCAT424(auVar9._24_4_,
                                                              CONCAT420(auVar21._20_4_,auVar9._0_20_
                                                                       )))));
      auVar13 = vpbroadcastd_avx512f();
      auVar14._56_4_ = auVar13._56_4_;
      auVar13 = vpbroadcastd_avx512f();
      auVar14._0_56_ = auVar21._0_56_;
      auVar14._60_4_ = auVar13._60_4_;
      auVar11 = vpaddd_avx512f(auVar11,auVar14);
      auVar21 = vmovdqu64_avx512f(auVar11);
      *(undefined1 (*) [64])out = auVar21;
    } while (3 < uVar5);
  }
  if ((int)uVar7 != 0) {
    puVar1 = (ulong *)((long)in + uVar7 * 2);
    do {
      uVar4 = (uint)(ushort)*(ulong *)in;
      lVar6 = 0;
      do {
        out[lVar6] = out[lVar6] + (uVar4 & 1);
        uVar4 = uVar4 >> 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      in = (uint16_t *)((long)in + 2);
    } while ((ulong *)in != puVar1);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128(const uint16_t* in, uint32_t n, uint32_t* out) {
    const uint64_t mask_bits = UINT64_C(0x1249124912491249); // 00000000 00000100 01110000 00010010 10001110 10110000 01101010 11110001
    const uint64_t mask_cnts = UINT64_C(0x003801C00E007007); // 00000000 00111000 00000001 11000000 00001110 00000000 01110000 00001000
    const uint64_t mask_0001 = UINT64_C(0x0001000100010001); // 00000000 00000001 00000000 00000001 00000000 00000001 00000000 00000001

    while (n >= 4) {
        uint64_t counter_a = 0; // 5 packed 12-bit counters (4 unused bits).
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // Terminate before overflowing the counters.
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~3;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 4) {
            uint64_t v = pospopcnt_loadu_u64(in);
            uint64_t a = v & mask_bits;         // 0b0001001001001001
            uint64_t b = (v >> 1)  & mask_bits; // 0b0010010010010010 >> 1
            uint64_t c = (v >> 2)  & mask_bits; // 0b0100100100100100 >> 2
            uint64_t d = (v >> 15) & mask_0001; // 0b1000000000000000 >> 15
            uint64_t hi_a, hi_b, hi_c;
            a = pospopcnt_umul128(a, mask_0001, &hi_a);
            b = pospopcnt_umul128(b, mask_0001, &hi_b);
            c = pospopcnt_umul128(c, mask_0001, &hi_c);
            a += hi_a; // Broadcast 3-bit counts.
            b += hi_b;
            c += hi_c;
            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d;
        }

        out[0]  += counter_a & 0x0FFF;
        out[1]  += counter_b & 0x0FFF;
        out[2]  += counter_c & 0x0FFF;
        out[3]  += (counter_a >> 51);
        out[4]  += (counter_b >> 51);
        out[5]  += (counter_c >> 51);
        out[6]  += (counter_a >> 38) & 0x0FFF;
        out[7]  += (counter_b >> 38) & 0x0FFF;
        out[8]  += (counter_c >> 38) & 0x0FFF;
        out[9]  += (counter_a >> 25) & 0x0FFF;
        out[10] += (counter_b >> 25) & 0x0FFF;
        out[11] += (counter_c >> 25) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d * mask_0001) >> 48;
    }

    // Residual words.
    for (const uint16_t* tail_end = &in[n]; in != tail_end; ++in) {
        uint16_t x = *in;
        for (int i = 0; i != 16; ++i) {
            out[i] += x & 1;
            x >>= 1;
        }
    }

    return 0;
}